

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O3

void threads_end(lzma_stream_coder_conflict1 *coder,lzma_allocator *allocator)

{
  worker_thread *pwVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if (coder->threads_initialized != 0) {
    lVar4 = 0x160;
    uVar3 = 0;
    do {
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)((long)&coder->threads->state + lVar4));
      if (iVar2 != 0) {
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
      }
      pwVar1 = coder->threads;
      *(undefined4 *)((long)pwVar1 + lVar4 + -0x160) = 4;
      iVar2 = pthread_cond_signal((pthread_cond_t *)((long)&pwVar1->allocator + lVar4));
      if (iVar2 != 0) {
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0x10c,"void mythread_cond_signal(mythread_cond *)");
      }
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)((long)&coder->threads->state + lVar4));
      if (iVar2 != 0) {
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x1c0;
    } while (uVar3 < coder->threads_initialized);
    if (coder->threads_initialized != 0) {
      lVar4 = 0x1b8;
      uVar3 = 0;
      do {
        iVar2 = pthread_join(*(pthread_t *)((long)&coder->threads->state + lVar4),(void **)0x0);
        if (iVar2 != 0) {
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                        ,0x1cd,"void threads_end(lzma_stream_coder *, const lzma_allocator *)");
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x1c0;
      } while (uVar3 < coder->threads_initialized);
    }
  }
  lzma_free(coder->threads,allocator);
  return;
}

Assistant:

static void
threads_end(lzma_stream_coder *coder, const lzma_allocator *allocator)
{
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			coder->threads[i].state = THR_EXIT;
			mythread_cond_signal(&coder->threads[i].cond);
		}
	}

	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		int ret = mythread_join(coder->threads[i].thread_id);
		assert(ret == 0);
		(void)ret;
	}

	lzma_free(coder->threads, allocator);
	return;
}